

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O2

void __thiscall re2c::Scanner::fatalf_at(Scanner *this,uint32_t line,char *fmt,...)

{
  char in_AL;
  char extraout_AL;
  undefined8 in_RCX;
  char *__s;
  char *__format;
  Scanner *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char szBuf [4096];
  undefined8 uStack_21d0;
  void ***pppvStack_21c8;
  undefined1 *puStack_21c0;
  undefined1 auStack_21b0 [24];
  char *pcStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 uStack_2170;
  undefined8 uStack_2160;
  undefined8 uStack_2150;
  undefined8 uStack_2140;
  undefined8 uStack_2130;
  undefined8 uStack_2120;
  undefined8 uStack_2110;
  char acStack_2100 [4095];
  undefined1 uStack_1101;
  char *pcStack_10f8;
  Scanner *pSStack_10f0;
  undefined8 local_10e8;
  void **local_10e0;
  undefined1 *local_10d8;
  undefined1 local_10c8 [24];
  undefined8 local_10b0;
  undefined8 local_10a8;
  undefined8 local_10a0;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 local_1038;
  undefined8 local_1028;
  char local_1018 [4095];
  undefined1 local_19;
  
  local_10d8 = local_10c8;
  if (in_AL != '\0') {
    local_1098 = in_XMM0_Qa;
    local_1088 = in_XMM1_Qa;
    local_1078 = in_XMM2_Qa;
    local_1068 = in_XMM3_Qa;
    local_1058 = in_XMM4_Qa;
    local_1048 = in_XMM5_Qa;
    local_1038 = in_XMM6_Qa;
    local_1028 = in_XMM7_Qa;
  }
  local_10e0 = &args[0].overflow_arg_area;
  local_10e8 = 0x3000000018;
  __s = local_1018;
  pSStack_10f0 = (Scanner *)0x14d400;
  local_10b0 = in_RCX;
  local_10a8 = in_R8;
  local_10a0 = in_R9;
  vsnprintf(__s,0x1000,fmt,&local_10e8);
  local_19 = 0x30;
  pSStack_10f0 = (Scanner *)0x14d417;
  __format = (char *)(ulong)line;
  this_00 = this;
  fatal_at(this,line,0,__s);
  puStack_21c0 = auStack_21b0;
  if (extraout_AL != '\0') {
    uStack_2170 = in_XMM1_Qa;
    uStack_2160 = in_XMM2_Qa;
    uStack_2150 = in_XMM3_Qa;
    uStack_2140 = in_XMM4_Qa;
    uStack_2130 = in_XMM5_Qa;
    uStack_2120 = in_XMM6_Qa;
    uStack_2110 = in_XMM7_Qa;
  }
  pppvStack_21c8 = &local_10e0;
  uStack_21d0 = 0x3000000010;
  pcStack_2198 = __s;
  uStack_2190 = in_R8;
  uStack_2188 = in_R9;
  pcStack_10f8 = (char *)(ulong)line;
  pSStack_10f0 = this;
  vsnprintf(acStack_2100,0x1000,__format,&uStack_21d0);
  uStack_1101 = 0x30;
  fatal(this_00,acStack_2100);
  return;
}

Assistant:

void Scanner::fatalf_at(uint32_t line, const char* fmt, ...) const
{
	char szBuf[4096];

	va_list args;
	
	va_start(args, fmt);
	vsnprintf(szBuf, sizeof(szBuf), fmt, args);
	va_end(args);
	
	szBuf[sizeof(szBuf)-1] = '0';
	
	fatal_at(line, 0, szBuf);
}